

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall cppcms::http::context::complete_response(context *this)

{
  bool bVar1;
  context *this_00;
  service *this_01;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *this_02;
  run_ctx rn;
  shared_ptr<cppcms::http::context> cont;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  __shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  http::response::finalize
            ((((this->d).ptr_)->response)._M_t.
             super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
             .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  bVar1 = cppcms::impl::cgi::connection::is_reuseable
                    ((this->conn_).
                     super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar1) {
    this_00 = (context *)operator_new(0x28);
    std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &(this->conn_).
                super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
    context(this_00,(shared_ptr<cppcms::impl::cgi::connection> *)&local_38);
    std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::http::context,void>
              ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&cont,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)&rn,
               &cont.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>);
    this_01 = service(this);
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    this_02 = (__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
    std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this_02,(__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)&rn);
    pcStack_40 = std::_Function_handler<void_(),_cppcms::http::(anonymous_namespace)::run_ctx>::
                 _M_invoke;
    local_48 = std::_Function_handler<void_(),_cppcms::http::(anonymous_namespace)::run_ctx>::
               _M_manager;
    local_58._M_unused._M_object = this_02;
    cppcms::service::post(this_01,(function<void_()> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rn.ctx.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cont.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->conn_).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void context::complete_response()
{
	response().finalize();
	if(conn_->is_reuseable()) {
		booster::shared_ptr<context> cont(new context(conn_));
		run_ctx rn = { cont };
		service().post(rn);
	}
	conn_.reset();
}